

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O0

int BCL::broadcast<int>(int *val,uint64_t root)

{
  debug_error *this;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  uint64_t uStack_18;
  int error_code;
  uint64_t root_local;
  int *val_local;
  
  uStack_18 = root;
  root_local = (uint64_t)val;
  local_1c = MPI_Bcast(val,4,&ompi_mpi_char,root & 0xffffffff,comm);
  if (local_1c != 0) {
    this = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_60,local_1c);
    std::operator+(&local_40,"BCL broadcast(): MPI_Bcast return error code ",&local_60);
    debug_error::debug_error(this,&local_40);
    __cxa_throw(this,&debug_error::typeinfo,debug_error::~debug_error);
  }
  return *(int *)root_local;
}

Assistant:

inline T broadcast(T &val, uint64_t root) {
  int error_code = MPI_Bcast(&val, sizeof(T), MPI_CHAR, root, BCL::comm);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL broadcast(): MPI_Bcast return error code " + std::to_string(error_code));
          }
  )
  return val;
}